

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O3

LY_ERR lysp_stmt_container(lysp_ctx *ctx,lysp_stmt *stmt,lysp_node *parent,lysp_node **siblings)

{
  lysp_ext_instance **exts;
  char **siblings_00;
  ly_stmt stmt_00;
  lysp_node *plVar1;
  lyd_node *plVar2;
  int iVar3;
  LY_ERR LVar4;
  lysp_node *parent_00;
  lysp_node *plVar5;
  char *pcVar6;
  char *format;
  uint32_t substmt_index;
  ly_ctx *plVar7;
  lysp_ext_instance **in_R8;
  lysp_ext_instance **in_R9;
  lysp_stmt *stmt_01;
  
  LVar4 = lysp_stmt_validate_value(ctx,Y_IDENTIF_ARG,stmt->arg);
  if (LVar4 == LY_SUCCESS) {
    parent_00 = (lysp_node *)calloc(1,0x80);
    if (parent_00 == (lysp_node *)0x0) {
      if (ctx == (lysp_ctx *)0x0) {
        plVar7 = (ly_ctx *)0x0;
      }
      else {
        plVar7 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar4 = LY_EMEM;
      ly_log(plVar7,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_container");
    }
    else {
      plVar1 = *siblings;
      if (*siblings != (lysp_node *)0x0) {
        do {
          plVar5 = plVar1;
          plVar1 = plVar5->next;
        } while (plVar1 != (lysp_node *)0x0);
        siblings = &plVar5->next;
      }
      *siblings = parent_00;
      if (ctx == (lysp_ctx *)0x0) {
        plVar7 = (ly_ctx *)0x0;
      }
      else {
        plVar7 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar4 = lydict_insert(plVar7,stmt->arg,0,&parent_00->name);
      if (LVar4 == LY_SUCCESS) {
        parent_00->nodetype = 1;
        parent_00->parent = parent;
        stmt_01 = stmt->child;
        LVar4 = LY_SUCCESS;
        if (stmt_01 != (lysp_stmt *)0x0) {
          exts = &parent_00->exts;
          siblings_00 = &parent_00[1].ref;
          iVar3 = (int)parent_00;
          do {
            stmt_00 = stmt_01->kw;
            if ((int)stmt_00 < 0x8000) {
              if ((int)stmt_00 < 0x400) {
                if ((int)stmt_00 < 0x20) {
                  if (stmt_00 == LY_STMT_NOTIFICATION) {
                    plVar2 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                    if (*(byte *)&plVar2[2].schema < 2) {
                      plVar7 = (ly_ctx *)**(undefined8 **)plVar2;
                      pcVar6 = "notification";
LAB_0016973c:
                      format = 
                      "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                      ;
LAB_0016976e:
                      ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar6,"container");
                      return LY_EVALID;
                    }
                    LVar4 = lysp_stmt_notif(ctx,stmt_01,parent_00,
                                            (lysp_node_notif **)&parent_00[1].exts);
                  }
                  else {
                    if (stmt_00 != LY_STMT_ACTION) goto LAB_001696de;
                    plVar2 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                    if (*(byte *)&plVar2[2].schema < 2) {
                      plVar7 = (ly_ctx *)**(undefined8 **)plVar2;
                      pcVar6 = "action";
                      goto LAB_0016973c;
                    }
                    LVar4 = lysp_stmt_action(ctx,stmt_01,parent_00,
                                             (lysp_node_action **)&parent_00[1].iffeatures);
                  }
                }
                else {
                  if (stmt_00 == LY_STMT_ANYDATA) {
                    plVar2 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                    if (*(byte *)&plVar2[2].schema < 2) {
                      plVar7 = (ly_ctx *)**(undefined8 **)plVar2;
                      pcVar6 = "anydata";
                      goto LAB_0016973c;
                    }
                  }
                  else if (stmt_00 != LY_STMT_ANYXML) {
                    if (stmt_00 != LY_STMT_CHOICE) goto LAB_001696de;
                    LVar4 = lysp_stmt_choice(ctx,stmt_01,parent_00,(lysp_node **)siblings_00);
                    goto LAB_0016969a;
                  }
                  LVar4 = lysp_stmt_any(ctx,stmt_01,parent_00,(lysp_node **)siblings_00);
                }
              }
              else if ((int)stmt_00 < 0x1000) {
                if (stmt_00 == LY_STMT_CONTAINER) {
                  LVar4 = lysp_stmt_container(ctx,stmt_01,parent_00,(lysp_node **)siblings_00);
                }
                else {
                  if (stmt_00 != LY_STMT_GROUPING) goto LAB_001696de;
                  LVar4 = lysp_stmt_grouping(ctx,stmt_01,parent_00,
                                             (lysp_node_grp **)&parent_00[1].dsc);
                }
              }
              else if (stmt_00 == LY_STMT_LEAF) {
                LVar4 = lysp_stmt_leaf(ctx,stmt_01,parent_00,(lysp_node **)siblings_00);
              }
              else if (stmt_00 == LY_STMT_LEAF_LIST) {
                LVar4 = lysp_stmt_leaflist(ctx,stmt_01,parent_00,(lysp_node **)siblings_00);
              }
              else {
                if (stmt_00 != LY_STMT_LIST) goto LAB_001696de;
                LVar4 = lysp_stmt_list(ctx,stmt_01,parent_00,(lysp_node **)siblings_00);
              }
            }
            else if ((int)stmt_00 < 0x1d0000) {
              if ((int)stmt_00 < 0x80000) {
                if (stmt_00 == LY_STMT_USES) {
                  LVar4 = lysp_stmt_uses(ctx,stmt_01,parent_00,(lysp_node **)siblings_00);
                }
                else {
                  if (stmt_00 != LY_STMT_CONFIG) goto LAB_001696de;
                  LVar4 = lysp_stmt_config(ctx,stmt_01,&parent_00->flags,exts);
                }
              }
              else {
                substmt_index = iVar3 + 0x20;
                if (stmt_00 == LY_STMT_DESCRIPTION) goto LAB_00169678;
                if (stmt_00 == LY_STMT_EXTENSION_INSTANCE) {
                  in_R8 = exts;
                  LVar4 = lysp_stmt_ext(ctx,stmt_01,LY_STMT_CONTAINER,0,exts);
                }
                else {
                  if (stmt_00 != LY_STMT_IF_FEATURE) goto LAB_001696de;
                  LVar4 = lysp_stmt_qnames(ctx,stmt_01,&parent_00->iffeatures,(yang_arg)exts,in_R8);
                }
              }
            }
            else if ((int)stmt_00 < 0x2c0000) {
              if (stmt_00 == LY_STMT_MUST) {
                LVar4 = lysp_stmt_restrs(ctx,stmt_01,(lysp_restr **)(parent_00 + 1));
              }
              else {
                substmt_index = iVar3 + 0x50;
                if ((stmt_00 != LY_STMT_PRESENCE) &&
                   (substmt_index = iVar3 + 0x28, stmt_00 != LY_STMT_REFERENCE)) {
LAB_001696de:
                  if (ctx == (lysp_ctx *)0x0) {
                    plVar7 = (ly_ctx *)0x0;
                  }
                  else {
                    plVar7 = (ly_ctx *)
                             **(undefined8 **)
                               (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                  }
                  pcVar6 = lyplg_ext_stmt2str(stmt_00);
                  format = "Invalid keyword \"%s\" as a child of \"%s\".";
                  goto LAB_0016976e;
                }
LAB_00169678:
                in_R8 = exts;
                LVar4 = lysp_stmt_text_field
                                  (ctx,stmt_01,substmt_index,(char **)0x2,(yang_arg)exts,in_R9);
              }
            }
            else if (stmt_00 == LY_STMT_STATUS) {
              LVar4 = lysp_stmt_status(ctx,stmt_01,&parent_00->flags,exts);
            }
            else if (stmt_00 == LY_STMT_TYPEDEF) {
              LVar4 = lysp_stmt_typedef(ctx,stmt_01,parent_00,(lysp_tpdf **)&parent_00[1].name);
            }
            else {
              if (stmt_00 != LY_STMT_WHEN) goto LAB_001696de;
              LVar4 = lysp_stmt_when(ctx,stmt_01,(lysp_when **)&parent_00[1].nodetype);
            }
LAB_0016969a:
            if (LVar4 != LY_SUCCESS) {
              return LVar4;
            }
            stmt_01 = stmt_01->next;
            LVar4 = LY_SUCCESS;
          } while (stmt_01 != (lysp_stmt *)0x0);
        }
      }
    }
  }
  return LVar4;
}

Assistant:

static LY_ERR
lysp_stmt_container(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_node *parent,
        struct lysp_node **siblings)
{
    struct lysp_node_container *cont;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_IDENTIF_ARG, stmt->arg));

    /* create new container structure */
    LY_LIST_NEW_RET(PARSER_CTX(ctx), siblings, cont, next, LY_EMEM);

    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &cont->name));
    cont->nodetype = LYS_CONTAINER;
    cont->parent = parent;

    /* parse substatements */
    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_CONFIG:
            LY_CHECK_RET(lysp_stmt_config(ctx, child, &cont->flags, &cont->exts));
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &cont->dsc, Y_STR_ARG, &cont->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(lysp_stmt_qnames(ctx, child, &cont->iffeatures, Y_STR_ARG, &cont->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &cont->ref, Y_STR_ARG, &cont->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(lysp_stmt_status(ctx, child, &cont->flags, &cont->exts));
            break;
        case LY_STMT_WHEN:
            LY_CHECK_RET(lysp_stmt_when(ctx, child, &cont->when));
            break;
        case LY_STMT_PRESENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &cont->presence, Y_STR_ARG, &cont->exts));
            break;
        case LY_STMT_ANYDATA:
            PARSER_CHECK_STMTVER2_RET(ctx, "anydata", "container");
        /* fall through */
        case LY_STMT_ANYXML:
            LY_CHECK_RET(lysp_stmt_any(ctx, child, &cont->node, &cont->child));
            break;
        case LY_STMT_CHOICE:
            LY_CHECK_RET(lysp_stmt_choice(ctx, child, &cont->node, &cont->child));
            break;
        case LY_STMT_CONTAINER:
            LY_CHECK_RET(lysp_stmt_container(ctx, child, &cont->node, &cont->child));
            break;
        case LY_STMT_LEAF:
            LY_CHECK_RET(lysp_stmt_leaf(ctx, child, &cont->node, &cont->child));
            break;
        case LY_STMT_LEAF_LIST:
            LY_CHECK_RET(lysp_stmt_leaflist(ctx, child, &cont->node, &cont->child));
            break;
        case LY_STMT_LIST:
            LY_CHECK_RET(lysp_stmt_list(ctx, child, &cont->node, &cont->child));
            break;
        case LY_STMT_USES:
            LY_CHECK_RET(lysp_stmt_uses(ctx, child, &cont->node, &cont->child));
            break;

        case LY_STMT_TYPEDEF:
            LY_CHECK_RET(lysp_stmt_typedef(ctx, child, &cont->node, &cont->typedefs));
            break;
        case LY_STMT_MUST:
            LY_CHECK_RET(lysp_stmt_restrs(ctx, child, &cont->musts));
            break;
        case LY_STMT_ACTION:
            PARSER_CHECK_STMTVER2_RET(ctx, "action", "container");
            LY_CHECK_RET(lysp_stmt_action(ctx, child, &cont->node, &cont->actions));
            break;
        case LY_STMT_GROUPING:
            LY_CHECK_RET(lysp_stmt_grouping(ctx, child, &cont->node, &cont->groupings));
            break;
        case LY_STMT_NOTIFICATION:
            PARSER_CHECK_STMTVER2_RET(ctx, "notification", "container");
            LY_CHECK_RET(lysp_stmt_notif(ctx, child, &cont->node, &cont->notifs));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, LY_STMT_CONTAINER, 0, &cont->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), "container");
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}